

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Skeleton::save(Skeleton *this,char *filename)

{
  XMLError XVar1;
  size_t sVar2;
  XMLElement *parentNode;
  XMLDocument xmlDoc;
  XMLDocument XStack_298;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Writing skeleton to file ",0x19);
  if (filename == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x323bc0);
  }
  else {
    sVar2 = strlen(filename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  tinyxml2::XMLDocument::XMLDocument(&XStack_298,true,PRESERVE_WHITESPACE);
  parentNode = tinyxml2::XMLDocument::NewElement(&XStack_298,"Skeleton");
  tinyxml2::XMLNode::InsertFirstChild(&XStack_298.super_XMLNode,&parentNode->super_XMLNode);
  saveJoint(this,&XStack_298,parentNode,this->root);
  XVar1 = tinyxml2::XMLDocument::SaveFile(&XStack_298,filename,false);
  if (XVar1 != XML_NO_ERROR) {
    printf("Error: %i\n",(ulong)XVar1);
  }
  tinyxml2::XMLDocument::~XMLDocument(&XStack_298);
  return;
}

Assistant:

void Skeleton::save(const char * filename)
   {
     cerr << "Writing skeleton to file " << filename << endl;
     XMLDocument xmlDoc;
     XMLElement* pRoot = xmlDoc.NewElement("Skeleton");
     xmlDoc.InsertFirstChild(pRoot);

     saveJoint(&xmlDoc, pRoot, root);

     XMLError eResult = xmlDoc.SaveFile(filename);
     XMLCheckResult(eResult);
   }